

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_psbt.cpp
# Opt level: O2

TransactionContext * __thiscall
cfd::Psbt::GetTransactionContext(TransactionContext *__return_storage_ptr__,Psbt *this)

{
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> utxo_list;
  string sStack_78;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> local_58 [2];
  
  cfd::core::Psbt::GetTransaction();
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_();
  TransactionContext::TransactionContext(__return_storage_ptr__,&sStack_78);
  std::__cxx11::string::~string((string *)&sStack_78);
  core::Transaction::~Transaction((Transaction *)local_58);
  GetUtxoDataAll(local_58,this,kMainnet);
  TransactionContext::CollectInputUtxo(__return_storage_ptr__,local_58);
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::~vector(local_58);
  return __return_storage_ptr__;
}

Assistant:

TransactionContext Psbt::GetTransactionContext() const {
  TransactionContext tx(GetTransaction().GetHex());
  std::vector<UtxoData> utxo_list = GetUtxoDataAll();
  tx.CollectInputUtxo(utxo_list);
  return tx;
}